

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cfdcore_key.h
# Opt level: O2

Privkey * __thiscall cfd::core::Privkey::operator=(Privkey *this,Privkey *param_1)

{
  undefined3 uVar1;
  NetType NVar2;
  
  ::std::vector<unsigned_char,_std::allocator<unsigned_char>_>::operator=
            ((vector<unsigned_char,_std::allocator<unsigned_char>_> *)this,
             (vector<unsigned_char,_std::allocator<unsigned_char>_> *)param_1);
  uVar1 = *(undefined3 *)&param_1->field_0x19;
  NVar2 = param_1->net_type_;
  this->is_compressed_ = param_1->is_compressed_;
  *(undefined3 *)&this->field_0x19 = uVar1;
  this->net_type_ = NVar2;
  return this;
}

Assistant:

class CFD_CORE_EXPORT Privkey {
 public:
  /**
   * @brief Private key byte size
   */
  static constexpr uint32_t kPrivkeySize = 32;  // EC_PRIVATE_KEY_LEN
  /**
   * @brief default constructor.
   */
  Privkey();

  /**
   * @brief constructor.
   * @param[in] byte_data ByteData object.
   * @param[in] net_type Mainnet or Testnet
   * @param[in] is_compressed pubkey compressed flag.
   */
  explicit Privkey(
      const ByteData &byte_data, NetType net_type = NetType::kMainnet,
      bool is_compressed = true);

  /**
   * @brief constructor.
   * @param[in] byte_data ByteData object.
   * @param[in] net_type Mainnet or Testnet
   * @param[in] is_compressed pubkey compressed flag.
   */
  explicit Privkey(
      const ByteData256 &byte_data, NetType net_type = NetType::kMainnet,
      bool is_compressed = true);

  /**
   * @brief constructor.
   * @param[in] hex_str PrivateKey HEX string
   * @param[in] net_type Mainnet or Testnet
   * @param[in] is_compressed pubkey compressed flag.
   */
  explicit Privkey(
      const std::string &hex_str, NetType net_type = NetType::kMainnet,
      bool is_compressed = true);

  /**
   * @brief Get HEX string.
   * @return HEX string
   */
  std::string GetHex() const;

  /**
   * @brief Get ByteData instance.
   * @return ByteData
   */
  ByteData GetData() const;

  /**
   * @brief Convert to WIF.
   * @param[in] net_type Mainnet or Testnet
   * @param[in] is_compressed   pubkey compressed flag.
   * @return WIF
   */
  std::string ConvertWif(NetType net_type, bool is_compressed = true) const;
  /**
   * @brief Get Wallet Import Format from member value.
   * @return WIF
   */
  std::string GetWif() const;

  /**
   * @brief Generate pubkey to privkey.
   * @param[in] is_compressed   pubkey compressed flag.
   * @return Pubkey
   */
  Pubkey GeneratePubkey(bool is_compressed = true) const;

  /**
   * @brief get pubkey from privkey.
   * @return Pubkey
   */
  Pubkey GetPubkey() const;

  /**
   * @brief Create new private key with tweak added.
   * @details This function doesn't have no side-effect.
   *     It always returns new instance of Privkey.
   * @param[in] tweak     tweak to be added
   * @return new instance of private key with tweak added.
   */
  Privkey CreateTweakAdd(const ByteData256 &tweak) const;
  /**
   * @brief Create new private key with tweak added.
   * @details This function doesn't have no side-effect.
   *     It always returns new instance of Privkey.
   * @param[in] tweak     tweak to be added
   * @return new instance of private key with tweak added.
   */
  Privkey CreateTweakAdd(const Privkey &tweak) const;

  /**
   * @brief Create new private key with tweak multiplied.
   * @details This function doesn't have no side-effect.
   *     It always returns new instance of Privkey.
   * @param[in] tweak     tweak to be added
   * @return new instance of private key with tweak added.
   */
  Privkey CreateTweakMul(const ByteData256 &tweak) const;
  /**
   * @brief Create new private key with tweak multiplied.
   * @details This function doesn't have no side-effect.
   *     It always returns new instance of Privkey.
   * @param[in] tweak     tweak to be added
   * @return new instance of private key with tweak added.
   */
  Privkey CreateTweakMul(const Privkey &tweak) const;

  /**
   * @brief Create new negated private key.
   * @details This function doesn't have no side-effect.
   *     It always returns new instance of Privkey.
   * @return new instance of private key with tweak added.
   */
  Privkey CreateNegate() const;

  /**
   * @brief Returns whether the private key setting status is invalid.
   * @retval true invalid
   * @retval false valid
   * @deprecated Scheduled to be deleted when organizing API
   */
  bool IsInvalid() const;

  /**
   * @brief Returns whether the Private Key setting status is normal.
   * @retval true  valid
   * @retval false invalid
   */
  bool IsValid() const;

  /**
   * @brief Check this privkey and argument key byte is match or not.
   * @param[in] privkey   private key to be compared
   * @retval true   match
   * @retval false  not match
   */
  bool Equals(const Privkey &privkey) const;

  /**
   * @brief calculate ec signature from sighash.
   * @param[in] signature_hash  signature hash
   * @param[in] has_grind_r     use EC_FLAG_GRIND_R.(default: true)
   * @return signature
   */
  ByteData CalculateEcSignature(
      const ByteData256 &signature_hash, bool has_grind_r = true) const;

  /**
   * @brief set pubkey compressed flag.
   * @param[in] is_compressed  pubkey compressed.
   */
  void SetPubkeyCompressed(bool is_compressed);
  /**
   * @brief set network type.
   * @param[in] net_type  network type.
   */
  void SetNetType(NetType net_type);

  /**
   * @brief Generate privkey from WIF.
   * @param[in] wif WIF
   * @param[in] net_type Mainnet or Testnet
   * @param[in] is_compressed  pubkey compress flag.
   * @return Privkey
   */
  static Privkey FromWif(
      const std::string &wif, NetType net_type = NetType::kCustomChain,
      bool is_compressed = true);

  /**
   * @brief Generate Privkey from random numbers.
   *
   * It may take some time because it repeats until it can be generated.
   * @return Privkey
   */
  static Privkey GenerageRandomKey();

  /**
   * @brief check wif format.
   * @param[in] wif WIF string.
   * @param[out] net_type  network type. (Mainnet or Testnet)
   * @param[out] is_compressed  pubkey compressed.
   * @retval true   wallet import format.
   * @retval false  other format.
   */
  static bool HasWif(
      const std::string &wif, NetType *net_type = nullptr,
      bool *is_compressed = nullptr);

  /**
   * @brief tweak add privkey.
   * @param[in] right   tweak privkey
   * @return tweaked privkey
   */
  Privkey operator+=(const Privkey &right);
  /**
   * @brief tweak add privkey.
   * @param[in] right   tweak data
   * @return tweaked privkey
   */
  Privkey operator+=(const ByteData256 &right);
  /**
   * @brief negate and tweak add for privkey.
   * @param[in] right   tweak privkey (before negate)
   * @return tweaked privkey
   */
  Privkey operator-=(const Privkey &right);
  /**
   * @brief negate and tweak add for privkey.
   * @param[in] right   tweak data (before negate)
   * @return tweaked privkey
   */
  Privkey operator-=(const ByteData256 &right);
  /**
   * @brief tweak mul for privkey.
   * @param[in] right   tweak privkey
   * @return tweaked privkey
   */
  Privkey operator*=(const Privkey &right);
  /**
   * @brief tweak mul for privkey.
   * @param[in] right   tweak data
   * @return tweaked privkey
   */
  Privkey operator*=(const ByteData256 &right);

 private:
  /**
   * @brief ByteData of Private key.
   */
  ByteData data_;
  /**
   * @brief pubkey compressed.
   */
  bool is_compressed_ = true;
  /**
   * @brief network type. 
   */
  NetType net_type_ = NetType::kMainnet;

  /**
   * @brief Verify that it is in the correct format as a private key.
   * @param[in] buffer  ByteData of privkey.
   * @retval true   valid
   * @retval false  invalid
   */
  static bool IsValid(const std::vector<uint8_t> &buffer);
}